

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O2

arith_uint256 * UintToArith256(arith_uint256 *__return_storage_ptr__,uint256 *a)

{
  long lVar1;
  int x;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint<256U>::base_uint(&__return_storage_ptr__->super_base_uint<256U>);
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    (__return_storage_ptr__->super_base_uint<256U>).pn[lVar2] =
         *(uint32_t *)((a->super_base_blob<256U>).m_data._M_elems + lVar2 * 4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

arith_uint256 UintToArith256(const uint256 &a)
{
    arith_uint256 b;
    for(int x=0; x<b.WIDTH; ++x)
        b.pn[x] = ReadLE32(a.begin() + x*4);
    return b;
}